

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int __thiscall xmrig::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t sVar1;
  int in_EAX;
  int extraout_EAX;
  char *__dest;
  void *pvVar2;
  size_t __n;
  
  __dest = this->m_data;
  sVar1 = this->m_size;
  if ((sVar1 == 0) || (sVar1 != *(size_t *)(dst + 8))) {
    if (__dest != (char *)0x0) {
      operator_delete__(__dest);
      in_EAX = extraout_EAX;
    }
    if (*(long *)dst == 0) {
      this->m_data = (char *)0x0;
      this->m_size = 0;
      return in_EAX;
    }
    sVar1 = *(size_t *)(dst + 8);
    this->m_size = sVar1;
    __n = sVar1 + 1;
    __dest = (char *)operator_new__(__n);
    this->m_data = __dest;
    pvVar2 = *(void **)dst;
  }
  else {
    pvVar2 = *(void **)dst;
    __n = sVar1 + 1;
  }
  pvVar2 = memcpy(__dest,pvVar2,__n);
  return (int)pvVar2;
}

Assistant:

void xmrig::String::copy(const String &other)
{
    if (m_size > 0 && m_size == other.m_size) {
        memcpy(m_data, other.m_data, m_size + 1);

        return;
    }

    delete [] m_data;

    if (other.m_data == nullptr) {
        m_size = 0;
        m_data = nullptr;

        return;
    }

    m_size = other.m_size;
    m_data = new char[m_size + 1];

    memcpy(m_data, other.m_data, m_size + 1);
}